

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-solver.cc
# Opt level: O0

void __thiscall
mp::SOLHandler_Easy::OnPrimalSolution<mp::VecReader<double>>
          (SOLHandler_Easy *this,VecReader<double> *rd)

{
  int iVar1;
  const_reference pvVar2;
  reference pvVar3;
  VecReader<double> *in_RSI;
  long in_RDI;
  double dVar4;
  int i;
  VecReader<double> *in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 in_stack_ffffffffffffffec;
  int iVar5;
  
  std::vector<double,_std::allocator<double>_>::clear
            ((vector<double,_std::allocator<double>_> *)0x13dd28);
  std::vector<double,_std::allocator<double>_>::resize
            ((vector<double,_std::allocator<double>_> *)in_RSI,
             CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
  iVar5 = 0;
  while( true ) {
    iVar1 = VecReader<double>::Size(in_RSI);
    if (iVar1 == 0) break;
    dVar4 = VecReader<double>::ReadNext(in_stack_ffffffffffffffd0);
    in_stack_ffffffffffffffd0 = (VecReader<double> *)(*(long *)(in_RDI + 0x118) + 0x30);
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(*(long *)(in_RDI + 0x110) + 0x18),
                        (long)iVar5);
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffffd0,
                        (long)*pvVar2);
    *pvVar3 = dVar4;
    iVar5 = iVar5 + 1;
  }
  return;
}

Assistant:

void OnPrimalSolution(VecReader& rd) {
    sol_.x_.clear();
    sol_.x_.resize(header_.num_vars);
    for (int i=0; rd.Size(); ++i)    // Permute
      sol_.x_[pd_.vperm_inv_[i]] = rd.ReadNext();
  }